

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

int reduce_pp_expression(Context_conflict1 *ctx)

{
  IncludeState *pIVar1;
  Token TVar2;
  int iVar3;
  Define *pDVar4;
  long lVar5;
  ulong uVar6;
  bool local_582;
  bool local_581;
  long val;
  int error;
  Token t_2;
  int p;
  Token t_1;
  Token t;
  int found;
  int paren;
  int precedence;
  int isleft;
  Token token;
  IncludeState *state;
  int done;
  int matched;
  size_t stacksize;
  size_t outputsize;
  Token TStack_528;
  Token previous_token;
  Token stack [64];
  RpnTokens output [128];
  IncludeState *orig_state;
  Context_conflict1 *ctx_local;
  
  pIVar1 = ctx->include_stack;
  outputsize._4_4_ = 0x100;
  stacksize = 0;
  _done = 0;
  state._4_4_ = 0;
  state._0_4_ = 0;
LAB_0013f942:
  if ((int)state != 0) {
    while( true ) {
      if (_done == 0) {
        val._0_4_ = 0;
        lVar5 = interpret_rpn((RpnTokens *)(stack + 0x3e),(int)stacksize,(int *)&val);
        if ((int)val == 0) {
          ctx_local._4_4_ = (uint)(lVar5 != 0);
        }
        else {
          fail(ctx,"Invalid expression");
          ctx_local._4_4_ = 0xffffffff;
        }
        return ctx_local._4_4_;
      }
      uVar6 = _done - 1;
      val._4_4_ = *(int *)((long)&outputsize + _done * 4 + 4);
      _done = uVar6;
      if (val._4_4_ == 0x28) break;
      if (0x7f < stacksize) {
        __assert_fail("outputsize < STATICARRAYLEN(output)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x729,"int reduce_pp_expression(Context *)");
      }
      output[stacksize - 1].isoperator = 1;
      output[stacksize - 1].value = val._4_4_;
      stacksize = stacksize + 1;
    }
    fail(ctx,"Unmatched \')\'");
    return -1;
  }
  _isleft = ctx->include_stack;
  precedence = lexer(_isleft);
  paren = 1;
  found = -1;
  if ((precedence == 0x21) || (precedence == 0x7e)) {
    paren = 0;
  }
  else if (precedence == 0x2d) {
    local_581 = outputsize._4_4_ == 0x102 || outputsize._4_4_ == 0x29;
    paren = (int)local_581;
    if (paren == 0) {
      precedence = 0x12d;
    }
  }
  else if (precedence == 0x2b) {
    local_582 = outputsize._4_4_ == 0x102 || outputsize._4_4_ == 0x29;
    paren = (int)local_582;
    if (paren == 0) {
      precedence = 0x12e;
    }
  }
  if (precedence != 0x101) {
    ctx->recursion_count = 0;
  }
  if (precedence == 10) {
    state._0_4_ = 1;
    goto LAB_00140038;
  }
  if (precedence == 0x28) {
    if (0x3f < _done) {
      __assert_fail("stacksize < STATICARRAYLEN(stack)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                    ,0x6e7,"int reduce_pp_expression(Context *)");
    }
    (&TStack_528)[_done] = 0x28;
    _done = _done + 1;
    goto LAB_00140038;
  }
  if (precedence == 0x29) {
    state._4_4_ = 0;
    while (_done != 0) {
      uVar6 = _done - 1;
      p = *(int *)((long)&outputsize + _done * 4 + 4);
      _done = uVar6;
      if (p == 0x28) {
        state._4_4_ = 1;
        break;
      }
      if (0x7f < stacksize) {
        __assert_fail("outputsize < STATICARRAYLEN(output)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x6f4,"int reduce_pp_expression(Context *)");
      }
      output[stacksize - 1].isoperator = 1;
      output[stacksize - 1].value = p;
      stacksize = stacksize + 1;
    }
    if (state._4_4_ == 0) {
      fail(ctx,"Unmatched \')\'");
      return -1;
    }
    goto LAB_00140038;
  }
  if (precedence == 0x101) goto LAB_0013fb1b;
  if (precedence == 0x102) {
    if (0x7f < stacksize) {
      __assert_fail("outputsize < STATICARRAYLEN(output)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                    ,0x6e3,"int reduce_pp_expression(Context *)");
    }
    output[stacksize - 1].isoperator = 0;
    iVar3 = token_to_int(_isleft);
    output[stacksize - 1].value = iVar3;
    stacksize = stacksize + 1;
  }
  else {
    if (precedence != 0x11d) {
      found = find_precedence(precedence);
      if (found < 0) {
        pushback(_isleft);
        fail(ctx,"Invalid expression");
        return -1;
      }
      while (_done != 0) {
        t_2 = (&TStack_528)[_done - 1];
        error = find_precedence(t_2);
        if ((error < 0) || (((paren == 0 || (error < found)) && ((paren != 0 || (error <= found)))))
           ) break;
        _done = _done - 1;
        if (0x7f < stacksize) {
          __assert_fail("outputsize < STATICARRAYLEN(output)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                        ,0x713,"int reduce_pp_expression(Context *)");
        }
        output[stacksize - 1].isoperator = 1;
        output[stacksize - 1].value = t_2;
        stacksize = stacksize + 1;
      }
      if (0x3f < _done) {
        __assert_fail("stacksize < STATICARRAYLEN(stack)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x71a,"int reduce_pp_expression(Context *)");
      }
      (&TStack_528)[_done] = precedence;
      _done = _done + 1;
      goto LAB_00140038;
    }
    if (_isleft != pIVar1) {
      pop_source(ctx);
      goto LAB_0013f942;
    }
    state._0_4_ = 1;
  }
  goto LAB_00140038;
LAB_0013fb1b:
  iVar3 = handle_pp_identifier(ctx);
  if (iVar3 != 0) goto LAB_0013f942;
  if ((_isleft->tokenlen == 7) && (iVar3 = memcmp(_isleft->token,"defined",7), iVar3 == 0)) {
    precedence = lexer(_isleft);
    t = (Token)(precedence == 0x28);
    if (t != 0) {
      precedence = lexer(_isleft);
    }
    if (precedence != 0x101) {
      fail(ctx,"operator \'defined\' requires an identifier");
      return -1;
    }
    pDVar4 = find_define_by_token(ctx);
    t_1 = (Token)(pDVar4 != (Define *)0x0);
    if ((t != 0) && (TVar2 = lexer(_isleft), TVar2 != 0x29)) {
      fail(ctx,"Unmatched \')\'");
      return -1;
    }
    if (0x7f < stacksize) {
      __assert_fail("outputsize < STATICARRAYLEN(output)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                    ,0x6d9,"int reduce_pp_expression(Context *)");
    }
    output[stacksize - 1].isoperator = 0;
    output[stacksize - 1].value = t_1;
    stacksize = stacksize + 1;
    goto LAB_0013f942;
  }
  precedence = 0x102;
  if (0x7f < stacksize) {
    __assert_fail("outputsize < STATICARRAYLEN(output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x6df,"int reduce_pp_expression(Context *)");
  }
  output[stacksize - 1].isoperator = 0;
  output[stacksize - 1].value = 0;
  stacksize = stacksize + 1;
LAB_00140038:
  outputsize._4_4_ = precedence;
  goto LAB_0013f942;
}

Assistant:

static int reduce_pp_expression(Context *ctx)
{
    IncludeState *orig_state = ctx->include_stack;
    RpnTokens output[128];
    Token stack[64];
    Token previous_token = TOKEN_UNKNOWN;
    size_t outputsize = 0;
    size_t stacksize = 0;
    int matched = 0;
    int done = 0;

    #define ADD_TO_OUTPUT(op, val) \
        assert(outputsize < STATICARRAYLEN(output)); \
        output[outputsize].isoperator = op; \
        output[outputsize].value = val; \
        outputsize++;

    #define PUSH_TO_STACK(t) \
        assert(stacksize < STATICARRAYLEN(stack)); \
        stack[stacksize] = t; \
        stacksize++;

    while (!done)
    {
        IncludeState *state = ctx->include_stack;
        Token token = lexer(state);
        int isleft = 1;
        int precedence = -1;

        if ( (token == ((Token) '!')) || (token == ((Token) '~')) )
            isleft = 0;
        else if (token == ((Token) '-'))
        {
            isleft = ((previous_token == TOKEN_INT_LITERAL) ||
                      (previous_token == ((Token) ')')));
            if (!isleft)
                token = TOKEN_PP_UNARY_MINUS;
        } // else if
        else if (token == ((Token) '+'))
        {
            isleft = ((previous_token == TOKEN_INT_LITERAL) ||
                      (previous_token == ((Token) ')')));
            if (!isleft)
                token = TOKEN_PP_UNARY_PLUS;
        } // else if

        if (token != TOKEN_IDENTIFIER)
            ctx->recursion_count = 0;

        switch (token)
        {
            case TOKEN_EOI:
                if (state != orig_state)  // end of a substate, or the expr?
                {
                    pop_source(ctx);
                    continue;  // substate, go again with the parent state.
                } // if
                done = 1;  // the expression itself is done.
                break;

            case ((Token) '\n'):
                done = 1;
                break;  // we're done!

            case TOKEN_IDENTIFIER:
                if (handle_pp_identifier(ctx))
                    continue;  // go again with new IncludeState.

                if ( (state->tokenlen == 7) &&
                     (memcmp(state->token, "defined", 7) == 0) )
                {
                    token = lexer(state);
                    const int paren = (token == ((Token) '('));
                    if (paren)  // gcc doesn't let us nest parens here, either.
                        token = lexer(state);
                    if (token != TOKEN_IDENTIFIER)
                    {
                        fail(ctx, "operator 'defined' requires an identifier");
                        return -1;
                    } // if
                    const int found = (find_define_by_token(ctx) != NULL);

                    if (paren)
                    {
                        if (lexer(state) != ((Token) ')'))
                        {
                            fail(ctx, "Unmatched ')'");
                            return -1;
                        } // if
                    } // if

                    ADD_TO_OUTPUT(0, found);
                    continue;
                } // if

                // can't replace identifier with a number? It becomes zero.
                token = TOKEN_INT_LITERAL;
                ADD_TO_OUTPUT(0, 0);
                break;

            case TOKEN_INT_LITERAL:
                ADD_TO_OUTPUT(0, token_to_int(state));
                break;

            case ((Token) '('):
                PUSH_TO_STACK((Token) '(');
                break;

            case ((Token) ')'):
                matched = 0;
                while (stacksize > 0)
                {
                    const Token t = stack[--stacksize];
                    if (t == ((Token) '('))
                    {
                        matched = 1;
                        break;
                    } // if
                    ADD_TO_OUTPUT(1, t);
                } // while

                if (!matched)
                {
                    fail(ctx, "Unmatched ')'");
                    return -1;
                } // if
                break;

            default:
                precedence = find_precedence(token);
                // bogus token, or two operators together.
                if (precedence < 0)
                {
                    pushback(state);
                    fail(ctx, "Invalid expression");
                    return -1;
                } // if

                else  // it's an operator.
                {
                    while (stacksize > 0)
                    {
                        const Token t = stack[stacksize-1];
                        const int p = find_precedence(t);
                        if ( (p >= 0) &&
                             ( ((isleft) && (precedence <= p)) ||
                               ((!isleft) && (precedence < p)) ) )
                        {
                            stacksize--;
                            ADD_TO_OUTPUT(1, t);
                        } // if
                        else
                        {
                            break;
                        } // else
                    } // while
                    PUSH_TO_STACK(token);
                } // else
                break;
        } // switch
        previous_token = token;
    } // while

    while (stacksize > 0)
    {
        const Token t = stack[--stacksize];
        if (t == ((Token) '('))
        {
            fail(ctx, "Unmatched ')'");
            return -1;
        } // if
        ADD_TO_OUTPUT(1, t);
    } // while

    #undef ADD_TO_OUTPUT
    #undef PUSH_TO_STACK

    // okay, you now have some validated data in reverse polish notation.
    #if DEBUG_PREPROCESSOR
    printf("PREPROCESSOR EXPRESSION RPN:");
    int i = 0;
    for (i = 0; i < outputsize; i++)
    {
        if (!output[i].isoperator)
            printf(" %d", output[i].value);
        else
        {
            switch (output[i].value)
            {
                case TOKEN_OROR: printf(" ||"); break;
                case TOKEN_ANDAND: printf(" &&"); break;
                case TOKEN_NEQ: printf(" !="); break;
                case TOKEN_EQL: printf(" =="); break;
                case TOKEN_LEQ: printf(" <="); break;
                case TOKEN_GEQ: printf(" >="); break;
                case TOKEN_LSHIFT: printf(" <<"); break;
                case TOKEN_RSHIFT: printf(" >>"); break;
                case TOKEN_PP_UNARY_PLUS: printf(" +"); break;
                case TOKEN_PP_UNARY_MINUS: printf(" -"); break;
                default: printf(" %c", output[i].value); break;
            } // switch
        } // else
    } // for
    printf("\n");
    #endif

    int error = 0;
    const long val = interpret_rpn(output, outputsize, &error);

    #if DEBUG_PREPROCESSOR
    printf("PREPROCESSOR RPN RESULT: %ld%s\n", val, error ? " (ERROR)" : "");
    #endif

    if (error)
    {
        fail(ctx, "Invalid expression");
        return -1;
    } // if

    return ((val) ? 1 : 0);
}